

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

int __thiscall EventDispatcher::removeAgentsByReceiver(EventDispatcher *this,void *recipient)

{
  uint uVar1;
  SyncRetEventAgent1<EventDispatcher,_int,_void_*> *this_00;
  ssize_t sVar2;
  TimerManager *this_01;
  size_t __n;
  void *__buf;
  int __flags;
  TimerManager *timerMan;
  SyncRetEventAgent1<EventDispatcher,_int,_void_*> *e;
  void *recipient_local;
  EventDispatcher *this_local;
  
  uVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent1<EventDispatcher,_int,_void_*> *)
              operator_new(0x38,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                           ,0x101);
    __flags = (int)recipient;
    __n = 0;
    SyncRetEventAgent1<EventDispatcher,_int,_void_*>::SyncRetEventAgent1
              (this_00,this,(event_method_t)removeAgentsByReceiver,(void *)0x0);
    Event::setPriority((Event *)this_00,1);
    sVar2 = SyncRetEventAgent<int>::send
                      ((SyncRetEventAgent<int> *)this_00,(int)this,__buf,__n,__flags);
    this_local._4_4_ = (int)sVar2;
  }
  else {
    this_01 = TimerManager::getInstance();
    TimerManager::removeAgentsByReceiver(this_01,recipient,&this->super_IEventDispatcher);
    EventQueue::RemoveAgentsByReceiver(&this->mQueue,recipient);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int EventDispatcher::removeAgentsByReceiver(void* recipient)
{
	if (not isThreadCurrent())
	{
		SyncRetEventAgent1<EventDispatcher, int, void*>* e = 
			jh_new SyncRetEventAgent1<EventDispatcher, int, void*>
			(this, &EventDispatcher::removeAgentsByReceiver, recipient);

		// I am a bad person, but it's either this or make all
		// EventAgent's publicly inherit from Event (instead of
		// Protected inheritance), and that's a big ugly change for
		// little benefit.
		((Event*)e)->setPriority(PRIORITY_HIGH);

		return e->send(this);
	}

	TimerManager *timerMan = TimerManager::getInstance();
	timerMan->removeAgentsByReceiver(recipient, this);
	mQueue.RemoveAgentsByReceiver(recipient);
	return 0;
}